

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O0

shared_ptr<QPDFJob::UOConfig> __thiscall QPDFJob::Config::underlay(Config *this)

{
  element_type *peVar1;
  reference pvVar2;
  UOConfig *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Config *in_RSI;
  shared_ptr<QPDFJob::UOConfig> sVar3;
  Config *this_local;
  
  peVar1 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)in_RSI->o);
  std::vector<QPDFJob::UnderOverlay,std::allocator<QPDFJob::UnderOverlay>>::
  emplace_back<char_const(&)[9]>
            ((vector<QPDFJob::UnderOverlay,std::allocator<QPDFJob::UnderOverlay>> *)
             &peVar1->underlay,(char (*) [9])0x4224e4);
  peVar1 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)in_RSI->o);
  pvVar2 = std::vector<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>::back
                     (&peVar1->underlay);
  peVar1 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)in_RSI->o);
  peVar1->under_overlay = pvVar2;
  this_00 = (UOConfig *)operator_new(8);
  UOConfig::UOConfig(this_00,in_RSI);
  std::shared_ptr<QPDFJob::UOConfig>::shared_ptr<QPDFJob::UOConfig,void>
            ((shared_ptr<QPDFJob::UOConfig> *)this,this_00);
  sVar3.super___shared_ptr<QPDFJob::UOConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar3.super___shared_ptr<QPDFJob::UOConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<QPDFJob::UOConfig>)
         sVar3.super___shared_ptr<QPDFJob::UOConfig,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<QPDFJob::UOConfig>
QPDFJob::Config::underlay()
{
    o.m->underlay.emplace_back("underlay");
    o.m->under_overlay = &o.m->underlay.back();
    return std::shared_ptr<UOConfig>(new UOConfig(this));
}